

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsErrors.cxx
# Opt level: O0

void cmCMakePresetsErrors::FILE_NOT_FOUND(string *filename,cmJSONState *state)

{
  string local_38;
  cmJSONState *local_18;
  cmJSONState *state_local;
  string *filename_local;
  
  local_18 = state;
  state_local = (cmJSONState *)filename;
  cmStrCat<char_const(&)[17],std::__cxx11::string_const&>
            (&local_38,(char (*) [17])"File not found: ",filename);
  cmJSONState::AddError(state,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void FILE_NOT_FOUND(const std::string& filename, cmJSONState* state)
{
  state->AddError(cmStrCat("File not found: ", filename));
}